

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void minja::destructuring_assign
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *var_names,shared_ptr<minja::Context> *context,Value *item)

{
  bool bVar1;
  size_type sVar2;
  element_type *peVar3;
  size_t sVar4;
  runtime_error *this;
  Value *pVVar5;
  undefined8 in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  size_t i;
  Value name;
  Value *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff28;
  string *v;
  Value *in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff60;
  Value *in_stack_ffffffffffffff68;
  Value *in_stack_ffffffffffffff78;
  ulong local_80;
  string local_68 [2];
  undefined8 local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  if (sVar2 == 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_8,0);
    v = local_68;
    Value::Value(in_stack_ffffffffffffff30,v);
    peVar3 = std::__shared_ptr_access<minja::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<minja::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x28cb19);
    (*peVar3->_vptr_Context[5])(peVar3,v,local_18);
    Value::~Value(in_stack_ffffffffffffff00);
    return;
  }
  bVar1 = Value::is_array((Value *)0x28cb79);
  if (bVar1) {
    sVar4 = Value::size(in_stack_ffffffffffffff78);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_8);
    if (sVar4 == sVar2) {
      for (local_80 = 0;
          sVar2 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(local_8), local_80 < sVar2; local_80 = local_80 + 1) {
        peVar3 = std::__shared_ptr_access<minja::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<minja::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x28cc4d);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_8,local_80);
        Value::Value(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        pVVar5 = Value::at(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        (*peVar3->_vptr_Context[5])(peVar3,&stack0xffffffffffffff30,pVVar5);
        Value::~Value((Value *)peVar3);
      }
      return;
    }
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this,"Mismatched number of variables and items in destructuring assignment");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void destructuring_assign(const std::vector<std::string> & var_names, const std::shared_ptr<Context> & context, Value& item) {
  if (var_names.size() == 1) {
      Value name(var_names[0]);
      context->set(name, item);
  } else {
      if (!item.is_array() || item.size() != var_names.size()) {
          throw std::runtime_error("Mismatched number of variables and items in destructuring assignment");
      }
      for (size_t i = 0; i < var_names.size(); ++i) {
          context->set(var_names[i], item.at(i));
      }
  }
}